

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
OneWireSimulationDataGenerator::Initialize
          (OneWireSimulationDataGenerator *this,U32 simulation_sample_rate,
          OneWireAnalyzerSettings *settings)

{
  OneWireAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  OneWireSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mOneWireSimulationData);
  SimulationChannelDescriptor::SetSampleRate((int)this + 0x18);
  SimulationChannelDescriptor::SetInitialBitState((int)this + 0x18);
  this->mSimOverdrive = (bool)(this->mSettings->mOverdrive & 1);
  return;
}

Assistant:

void OneWireSimulationDataGenerator::Initialize( U32 simulation_sample_rate, OneWireAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mOneWireSimulationData.SetChannel( mSettings->mOneWireChannel );
    mOneWireSimulationData.SetSampleRate( simulation_sample_rate );

    mOneWireSimulationData.SetInitialBitState( BIT_HIGH );
    // mOneWireSimulationData.Advance( 1000 );
    mSimOverdrive = mSettings->mOverdrive;
}